

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRReader.cpp
# Opt level: O3

Barcodes * __thiscall
ZXing::QRCode::Reader::decode
          (Barcodes *__return_storage_ptr__,Reader *this,BinaryBitmap *image,int maxSymbols)

{
  ConcentricPattern *__args;
  ConcentricPattern *__args_00;
  double dVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  Reader *pRVar5;
  uint uVar6;
  BitMatrix *image_00;
  __normal_iterator<const_ZXing::ConcentricPattern_*,_std::vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>_>
  _Var7;
  int iVar8;
  ConcentricPattern *fp;
  FinderPatternSet *fp_00;
  pointer fp_01;
  pointer pCVar9;
  vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> usedFPs;
  FinderPatternSets allFPSets;
  FinderPatterns allFPs;
  DetectorResult detectorResult;
  DecoderResult decoderResult;
  void *local_1a8;
  iterator iStack_1a0;
  ConcentricPattern *local_198;
  Reader *local_188;
  vector<ZXing::Result,std::allocator<ZXing::Result>> *local_180;
  BarcodeFormat local_174;
  FinderPatternSets local_170;
  vector<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_> local_158;
  DetectorResult local_140;
  DecoderResult local_100;
  
  image_00 = BinaryBitmap::getBitMatrix(image);
  if (image_00 == (BitMatrix *)0x0) {
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    FindFinderPatterns(&local_158,image_00,
                       (bool)((byte)*(undefined4 *)(this->super_Reader)._opts & 1));
    local_198 = (ConcentricPattern *)0x0;
    local_1a8 = (void *)0x0;
    iStack_1a0._M_current = (ConcentricPattern *)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar6 = (((this->super_Reader)._opts)->_formats).i;
    local_188 = this;
    local_180 = (vector<ZXing::Result,std::allocator<ZXing::Result>> *)__return_storage_ptr__;
    if (uVar6 == 0 || (uVar6 >> 0xd & 1) != 0) {
      GenerateFinderPatternSets(&local_170,&local_158);
      fp_00 = (FinderPatternSet *)
              CONCAT44(local_170.
                       super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_170.
                       super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (fp_00 != local_170.
                   super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                            (local_1a8,iStack_1a0._M_current,fp_00);
          if (_Var7._M_current == iStack_1a0._M_current) {
            __args = &fp_00->tl;
            _Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                              (local_1a8,iStack_1a0._M_current,__args);
            if (_Var7._M_current == iStack_1a0._M_current) {
              __args_00 = &fp_00->tr;
              _Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                                (local_1a8,iStack_1a0._M_current,__args_00);
              if (_Var7._M_current == iStack_1a0._M_current) {
                SampleQR(&local_140,image_00,fp_00);
                if (local_140._bits._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start ==
                    local_140._bits._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
LAB_0018ab41:
                  bVar3 = false;
                }
                else {
                  Decode(&local_100,&local_140._bits);
                  if ((local_100._content.bytes.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       local_100._content.bytes.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish) && (local_100._error._type == None)) {
                    if (iStack_1a0._M_current == local_198) {
                      std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                      ::_M_realloc_insert<ZXing::ConcentricPattern_const&>
                                ((vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                                  *)&local_1a8,iStack_1a0,&fp_00->bl);
                    }
                    else {
                      uVar4 = *(undefined4 *)&(fp_00->bl).field_0x14;
                      (iStack_1a0._M_current)->size = (fp_00->bl).size;
                      *(undefined4 *)&(iStack_1a0._M_current)->field_0x14 = uVar4;
                      dVar1 = (fp_00->bl).super_PointF.y;
                      ((iStack_1a0._M_current)->super_PointF).x = (fp_00->bl).super_PointF.x;
                      ((iStack_1a0._M_current)->super_PointF).y = dVar1;
                      iStack_1a0._M_current = iStack_1a0._M_current + 1;
                    }
                    if (iStack_1a0._M_current == local_198) {
                      std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                      ::_M_realloc_insert<ZXing::ConcentricPattern_const&>
                                ((vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                                  *)&local_1a8,iStack_1a0,__args);
                    }
                    else {
                      uVar4 = *(undefined4 *)&(fp_00->tl).field_0x14;
                      (iStack_1a0._M_current)->size = (fp_00->tl).size;
                      *(undefined4 *)&(iStack_1a0._M_current)->field_0x14 = uVar4;
                      dVar1 = (fp_00->tl).super_PointF.y;
                      ((iStack_1a0._M_current)->super_PointF).x = (__args->super_PointF).x;
                      ((iStack_1a0._M_current)->super_PointF).y = dVar1;
                      iStack_1a0._M_current = iStack_1a0._M_current + 1;
                    }
                    if (iStack_1a0._M_current == local_198) {
                      std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                      ::_M_realloc_insert<ZXing::ConcentricPattern_const&>
                                ((vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>
                                  *)&local_1a8,iStack_1a0,__args_00);
                    }
                    else {
                      uVar4 = *(undefined4 *)&(fp_00->tr).field_0x14;
                      (iStack_1a0._M_current)->size = (fp_00->tr).size;
                      *(undefined4 *)&(iStack_1a0._M_current)->field_0x14 = uVar4;
                      dVar1 = (fp_00->tr).super_PointF.y;
                      ((iStack_1a0._M_current)->super_PointF).x = (__args_00->super_PointF).x;
                      ((iStack_1a0._M_current)->super_PointF).y = dVar1;
                      iStack_1a0._M_current = iStack_1a0._M_current + 1;
                    }
                  }
                  uVar6 = *(uint *)(local_188->super_Reader)._opts;
                  if (local_100._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                      local_100._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    if (((byte)(uVar6 >> 9) & local_100._error._type != None) != 0)
                    goto LAB_0018aa32;
LAB_0018aa7c:
                    bVar3 = false;
                    bVar2 = true;
                  }
                  else {
                    if ((uVar6 >> 9 & 1) == 0 && local_100._error._type != None) goto LAB_0018aa7c;
LAB_0018aa32:
                    local_174 = QRCode;
                    std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
                    emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                              ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                               __return_storage_ptr__,&local_100,&local_140,&local_174);
                    if ((maxSymbols == 0) ||
                       ((int)((ulong)((long)(__return_storage_ptr__->
                                            super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(__return_storage_ptr__->
                                           super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>
                                           )._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        0x684bda13 != maxSymbols)) goto LAB_0018aa7c;
                    bVar3 = true;
                    bVar2 = false;
                  }
                  if (local_100._extra.
                      super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_100._extra.
                               super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
                    operator_delete(local_100._error._msg._M_dataplus._M_p,
                                    local_100._error._msg.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._structuredAppend.id._M_dataplus._M_p !=
                      &local_100._structuredAppend.id.field_2) {
                    operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                                    local_100._structuredAppend.id.field_2._M_allocated_capacity + 1
                                   );
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
                    operator_delete(local_100._ecLevel._M_dataplus._M_p,
                                    local_100._ecLevel.field_2._M_allocated_capacity + 1);
                  }
                  if (local_100._content.encodings.
                      super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_100._content.encodings.
                                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_100._content.encodings.
                                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (local_100._content.bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_100._content.bytes.
                                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          .
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_100._content.bytes.
                                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          .
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (bVar2) goto LAB_0018ab41;
                }
                if (local_140._bits._bits.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_140._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_140._bits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_140._bits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (bVar3) break;
              }
            }
          }
          fp_00 = fp_00 + 1;
        } while (fp_00 != local_170.
                          super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        fp_00 = (FinderPatternSet *)
                CONCAT44(local_170.
                         super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_170.
                         super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
      }
      pRVar5 = local_188;
      if (fp_00 != (FinderPatternSet *)0x0) {
        operator_delete(fp_00,(long)local_170.
                                    super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)fp_00
                       );
      }
      uVar6 = (((pRVar5->super_Reader)._opts)->_formats).i;
    }
    pCVar9 = local_158.
             super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((uVar6 == 0 || (uVar6 >> 0x10 & 1) != 0) &&
       (((maxSymbols == 0 ||
         ((int)((ulong)((long)(__return_storage_ptr__->
                              super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(__return_storage_ptr__->
                             super__Vector_base<ZXing::Result,_std::allocator<ZXing::Result>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3) * 0x684bda13 !=
          maxSymbols)) &&
        (local_158.
         super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         local_158.
         super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>.
         _M_impl.super__Vector_impl_data._M_finish)))) {
      fp_01 = local_158.
              super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
              ._M_impl.super__Vector_impl_data._M_start;
      do {
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                          (local_1a8,iStack_1a0._M_current,fp_01);
        if (_Var7._M_current == iStack_1a0._M_current) {
          SampleMQR(&local_140,image_00,fp_01);
          if (local_140._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_140._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_0018ad86:
            bVar3 = false;
          }
          else {
            Decode(&local_100,&local_140._bits);
            uVar6 = *(uint *)(local_188->super_Reader)._opts;
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if (((byte)(uVar6 >> 9) & local_100._error._type != None) != 0) goto LAB_0018ac77;
LAB_0018acbe:
              bVar3 = false;
              bVar2 = true;
            }
            else {
              if ((uVar6 >> 9 & 1) == 0 && local_100._error._type != None) goto LAB_0018acbe;
LAB_0018ac77:
              local_170.
              super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x10000;
              std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
              emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                        ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                         __return_storage_ptr__,&local_100,&local_140,(BarcodeFormat *)&local_170);
              if ((maxSymbols == 0) ||
                 ((int)((ulong)(*(long *)((long)__return_storage_ptr__ + 8) -
                               *(long *)__return_storage_ptr__) >> 3) * 0x684bda13 != maxSymbols))
              goto LAB_0018acbe;
              bVar3 = true;
              bVar2 = false;
            }
            if (local_100._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100._extra.
                         super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
              operator_delete(local_100._error._msg._M_dataplus._M_p,
                              local_100._error._msg.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._structuredAppend.id._M_dataplus._M_p !=
                &local_100._structuredAppend.id.field_2) {
              operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                              local_100._structuredAppend.id.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
              operator_delete(local_100._ecLevel._M_dataplus._M_p,
                              local_100._ecLevel.field_2._M_allocated_capacity + 1);
            }
            if (local_100._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            __return_storage_ptr__ = (Barcodes *)local_180;
            if (bVar2) goto LAB_0018ad86;
          }
          if (local_140._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_140._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_140._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_140._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar3) break;
        }
        fp_01 = fp_01 + 1;
      } while (fp_01 != pCVar9);
      uVar6 = (((local_188->super_Reader)._opts)->_formats).i;
    }
    if (((uVar6 == 0 || (uVar6 >> 0x11 & 1) != 0) &&
        ((maxSymbols == 0 ||
         ((int)((ulong)((long)*(pointer *)((long)__return_storage_ptr__ + 8) -
                       *(long *)__return_storage_ptr__) >> 3) * 0x684bda13 != maxSymbols)))) &&
       (local_158.
        super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_158.
        super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      pCVar9 = local_158.
               super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<ZXing::ConcentricPattern_const*,std::vector<ZXing::ConcentricPattern,std::allocator<ZXing::ConcentricPattern>>>,__gnu_cxx::__ops::_Iter_equals_val<ZXing::ConcentricPattern_const>>
                          (local_1a8,iStack_1a0._M_current,pCVar9);
        if (_Var7._M_current == iStack_1a0._M_current) {
          SampleRMQR(&local_140,image_00,pCVar9);
          if (local_140._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_140._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
LAB_0018afb2:
            iVar8 = 0;
          }
          else {
            Decode(&local_100,&local_140._bits);
            uVar6 = *(uint *)(local_188->super_Reader)._opts;
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start ==
                local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              if (((byte)(uVar6 >> 9) & local_100._error._type != None) != 0) goto LAB_0018aea3;
LAB_0018aeea:
              iVar8 = 0;
              bVar2 = true;
            }
            else {
              if ((uVar6 >> 9 & 1) == 0 && local_100._error._type != None) goto LAB_0018aeea;
LAB_0018aea3:
              local_170.
              super__Vector_base<ZXing::QRCode::FinderPatternSet,_std::allocator<ZXing::QRCode::FinderPatternSet>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x20000;
              std::vector<ZXing::Result,std::allocator<ZXing::Result>>::
              emplace_back<ZXing::DecoderResult,ZXing::DetectorResult,ZXing::BarcodeFormat>
                        ((vector<ZXing::Result,std::allocator<ZXing::Result>> *)
                         __return_storage_ptr__,&local_100,&local_140,(BarcodeFormat *)&local_170);
              if ((maxSymbols == 0) ||
                 ((int)((ulong)(*(long *)((long)__return_storage_ptr__ + 8) -
                               *(long *)__return_storage_ptr__) >> 3) * 0x684bda13 != maxSymbols))
              goto LAB_0018aeea;
              iVar8 = 6;
              bVar2 = false;
            }
            if (local_100._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_100._extra.
                         super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._error._msg._M_dataplus._M_p != &local_100._error._msg.field_2) {
              operator_delete(local_100._error._msg._M_dataplus._M_p,
                              local_100._error._msg.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._structuredAppend.id._M_dataplus._M_p !=
                &local_100._structuredAppend.id.field_2) {
              operator_delete(local_100._structuredAppend.id._M_dataplus._M_p,
                              local_100._structuredAppend.id.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._ecLevel._M_dataplus._M_p != &local_100._ecLevel.field_2) {
              operator_delete(local_100._ecLevel._M_dataplus._M_p,
                              local_100._ecLevel.field_2._M_allocated_capacity + 1);
            }
            if (local_100._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_100._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_100._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_100._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            __return_storage_ptr__ = (Barcodes *)local_180;
            if (bVar2) goto LAB_0018afb2;
          }
          if (local_140._bits._bits.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_140._bits._bits.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_140._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_140._bits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (iVar8 != 0) break;
        }
        pCVar9 = pCVar9 + 1;
      } while (pCVar9 != local_158.
                         super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_1a8 != (void *)0x0) {
      operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
    }
    if (local_158.
        super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>.
        _M_impl.super__Vector_impl_data._M_start != (ConcentricPattern *)0x0) {
      operator_delete(local_158.
                      super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_158.
                            super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.
                            super__Vector_base<ZXing::ConcentricPattern,_std::allocator<ZXing::ConcentricPattern>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (Barcodes *)(vector<ZXing::Result,std::allocator<ZXing::Result>> *)__return_storage_ptr__;
}

Assistant:

Barcodes Reader::decode(const BinaryBitmap& image, int maxSymbols) const
{
	auto binImg = image.getBitMatrix();
	if (binImg == nullptr)
		return {};

#ifdef PRINT_DEBUG
	LogMatrixWriter lmw(log, *binImg, 5, "qr-log.pnm");
#endif
	
	auto allFPs = FindFinderPatterns(*binImg, _opts.tryHarder());

#ifdef PRINT_DEBUG
	printf("allFPs: %d\n", Size(allFPs));
#endif

	std::vector<ConcentricPattern> usedFPs;
	Barcodes res;
	
	if (_opts.hasFormat(BarcodeFormat::QRCode)) {
		auto allFPSets = GenerateFinderPatternSets(allFPs);
		for (const auto& fpSet : allFPSets) {
			if (Contains(usedFPs, fpSet.bl) || Contains(usedFPs, fpSet.tl) || Contains(usedFPs, fpSet.tr))
				continue;

			logFPSet(fpSet);

			auto detectorResult = SampleQR(*binImg, fpSet);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid()) {
					usedFPs.push_back(fpSet.bl);
					usedFPs.push_back(fpSet.tl);
					usedFPs.push_back(fpSet.tr);
				}
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::QRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}
			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::MicroQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::MicroQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}
	
	if (_opts.hasFormat(BarcodeFormat::RMQRCode) && !(maxSymbols && Size(res) == maxSymbols)) {
		// TODO proper
		for (const auto& fp : allFPs) {
			if (Contains(usedFPs, fp))
				continue;

			auto detectorResult = SampleRMQR(*binImg, fp);
			if (detectorResult.isValid()) {
				auto decoderResult = Decode(detectorResult.bits());
				if (decoderResult.isValid(_opts.returnErrors())) {
					res.emplace_back(std::move(decoderResult), std::move(detectorResult), BarcodeFormat::RMQRCode);
					if (maxSymbols && Size(res) == maxSymbols)
						break;
				}

			}
		}
	}

	return res;
}